

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_symbolCaptureBinding_create
          (sysbvm_context_t *context,sysbvm_tuple_t capturedBinding,sysbvm_tuple_t ownerFunction,
          size_t vectorIndex)

{
  anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 aVar1;
  _Bool _Var2;
  sysbvm_object_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  
  _Var2 = sysbvm_tuple_isKindOf(context,capturedBinding,(context->roots).symbolBindingType);
  if (!_Var2) {
    sysbvm_error("Expected a symbol binding");
  }
  psVar3 = sysbvm_context_allocatePointerTuple(context,(context->roots).symbolCaptureBindingType,8);
  psVar3->field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(capturedBinding + 0x10)
  ;
  aVar1 = *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(capturedBinding + 0x30);
  psVar3[1].field_1 =
       *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(capturedBinding + 0x28);
  psVar3[2].header.field_0 = aVar1;
  psVar3[2].header.identityHashAndFlags = (int)ownerFunction;
  psVar3[2].header.objectSize = (int)(ownerFunction >> 0x20);
  sVar4 = sysbvm_tuple_uint64_encode(context,vectorIndex);
  psVar3[2].field_1.pointers[0] = sVar4;
  psVar3[3].header.field_0.typePointer = capturedBinding;
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolCaptureBinding_create(sysbvm_context_t *context, sysbvm_tuple_t capturedBinding, sysbvm_tuple_t ownerFunction, size_t vectorIndex)
{
    if(!sysbvm_tuple_isKindOf(context, capturedBinding, context->roots.symbolBindingType))
        sysbvm_error("Expected a symbol binding");

    sysbvm_symbolBinding_t *capturedBindingObject = (sysbvm_symbolBinding_t*)capturedBinding;

    sysbvm_symbolCaptureBinding_t *result = (sysbvm_symbolCaptureBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolCaptureBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolCaptureBinding_t));
    result->super.super.sourcePosition = capturedBindingObject->sourcePosition;
    result->super.super.super.name = capturedBindingObject->super.name;
    result->super.super.type = capturedBindingObject->type;
    result->super.ownerFunction = ownerFunction;
    result->super.vectorIndex = sysbvm_tuple_size_encode(context, vectorIndex);
    result->capturedBinding = capturedBinding;
    return (sysbvm_tuple_t)result;
}